

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CleanupMaterialDataT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,
          TPZVec<TPZMaterialDataT<std::complex<double>_>_> *dataVec)

{
  int64_t iVar1;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar2;
  TPZMaterialDataT<std::complex<double>_> *pTVar3;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> *in_RSI;
  long in_RDI;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZVec<int> nshape;
  int64_t nref;
  int64_t in_stack_ffffffffffffff88;
  TPZVec<int> *in_stack_ffffffffffffff90;
  TPZVec<int> *pTVar4;
  int64_t local_40;
  
  iVar1 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0x78));
  TPZVec<int>::TPZVec(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    this_00 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),local_40);
    pTVar2 = TPZCompElSide::Element(this_00);
    if (pTVar2 == (TPZCompEl *)0x0) {
      in_stack_ffffffffffffff90 = (TPZVec<int> *)0x0;
    }
    else {
      in_stack_ffffffffffffff90 =
           (TPZVec<int> *)
           __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
    }
    if (in_stack_ffffffffffffff90 != (TPZVec<int> *)0x0) {
      pTVar4 = in_stack_ffffffffffffff90;
      pTVar3 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](in_RSI,local_40);
      (*in_stack_ffffffffffffff90->_vptr_TPZVec[0x54])(in_stack_ffffffffffffff90,pTVar3);
      in_stack_ffffffffffffff90 = pTVar4;
    }
  }
  TPZVec<int>::~TPZVec(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CleanupMaterialDataT(TPZVec<TPZMaterialDataT<TVar>> &dataVec)
{

    int64_t nref = this->fElementVec.size();

    TPZVec<int> nshape(nref);
    for (int64_t iref = 0; iref < nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (!msp) {
            continue;
        }
        // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
        msp->CleanupMaterialData(dataVec[iref]);
    }
}